

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O2

void __thiscall Master::Master(Master *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int t;
  QSettings *pQVar4;
  QDebug *pQVar5;
  QString *s2;
  undefined8 uVar6;
  Master *ctx;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  char *local_90;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<const_AudioDevice_*> local_48;
  
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_001a6a00;
  (this->synthProfileName).d.d = (Data *)0x0;
  (this->synthProfileName).d.ptr = (char16_t *)0x0;
  (this->synthProfileName).d.size = 0;
  (this->synthRoutes).d.d = (Data *)0x0;
  (this->synthRoutes).d.ptr = (SynthRoute **)0x0;
  (this->synthRoutes).d.size = 0;
  (this->audioDrivers).d.d = (Data *)0x0;
  (this->audioDrivers).d.ptr = (AudioDriver **)0x0;
  (this->audioDrivers).d.size = 0;
  (this->audioDevices).d.d = (Data *)0x0;
  (this->audioDevices).d.ptr = (AudioDevice **)0x0;
  (this->audioDevices).d.size = 0;
  (this->defaultAudioDriverId).d.d = (Data *)0x0;
  (this->defaultAudioDriverId).d.ptr = (char16_t *)0x0;
  (this->defaultAudioDriverId).d.size = 0;
  (this->defaultAudioDeviceName).d.d = (Data *)0x0;
  (this->defaultAudioDeviceName).d.ptr = (char16_t *)0x0;
  (this->defaultAudioDeviceName).d.size = 0;
  if (instance == (Master *)0x0) {
    instance = this;
    this->maxSessions = 0;
    QObject::thread();
    ctx = this;
    QObject::moveToThread((QThread *)this);
    MasterClock::init((EVP_PKEY_CTX *)ctx);
    pQVar4 = (QSettings *)operator_new(0x10);
    QString::QString((QString *)&local_a8,"muntemu.org");
    QString::QString((QString *)&local_c8,"Munt mt32emu-qt");
    QSettings::QSettings(pQVar4,(QString *)&local_a8,(QString *)&local_c8,(QObject *)0x0);
    this->settings = pQVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    pQVar4 = this->settings;
    QString::QString((QString *)&local_68,"Master/settingsVersion");
    QVariant::QVariant((QVariant *)&local_c8,1);
    QSettings::value((QString *)&local_a8,(QVariant *)pQVar4);
    t = QVariant::toInt((bool *)local_a8.data);
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (t != 2) {
      pQVar4 = this->settings;
      local_a8._0_4_ = 2;
      local_a8._20_4_ = 0;
      local_a8._4_8_ = 0;
      local_a8._12_8_ = 0;
      local_90 = "default";
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<((QDebug *)&local_c8.shared,"Migrating settings from version");
      pQVar5 = QDebug::operator<<(pQVar5,t);
      pQVar5 = QDebug::operator<<(pQVar5,"to version");
      QDebug::operator<<(pQVar5,2);
      QDebug::~QDebug((QDebug *)&local_c8.shared);
      if (t == 1) {
        AudioDriver::migrateAudioSettingsFromVersion1();
        QString::QString((QString *)&local_c8,"Master/settingsVersion");
        QVariant::QVariant((QVariant *)&local_a8,2);
        QSettings::setValue((QString *)pQVar4,(QVariant *)local_c8.data);
        QVariant::~QVariant((QVariant *)&local_a8);
        this_00 = &local_c8;
      }
      else {
        local_a8._0_4_ = 2;
        local_a8._4_8_ = 0;
        local_a8._12_8_ = 0;
        local_a8._20_4_ = 0;
        local_90 = "default";
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)&local_c8.shared,"Migration failed");
        QDebug::~QDebug((QDebug *)&local_c8.shared);
        QString::QString((QString *)&local_a8,"Unsupported settings version");
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        s2 = QString::setNum((QString *)&local_88,t,10);
        operator+((QString *)&local_68,"Unable to load application settings of unsupported version "
                  ,s2);
        operator+((QString *)&local_c8,(QString *)&local_68,".\nPlease, check the settings!");
        QMessageBox::warning(0,&local_a8,&local_c8,0x400,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        this_00 = &local_a8;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    }
    pQVar4 = this->settings;
    QString::QString((QString *)&local_88,"Master/defaultSynthProfile");
    QVariant::QVariant((QVariant *)&local_c8,"default");
    QSettings::value((QString *)&local_a8,(QVariant *)pQVar4);
    QVariant::toString();
    pDVar2 = (this->synthProfileName).d.d;
    pcVar3 = (this->synthProfileName).d.ptr;
    (this->synthProfileName).d.d = local_68.d;
    (this->synthProfileName).d.ptr = local_68.ptr;
    qVar1 = (this->synthProfileName).d.size;
    (this->synthProfileName).d.size = local_68.size;
    local_68.d = pDVar2;
    local_68.ptr = pcVar3;
    local_68.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    this->trayIcon = (QSystemTrayIcon *)0x0;
    pQVar4 = this->settings;
    QString::QString((QString *)&local_88,"Master/DefaultAudioDriver");
    local_c8.shared = (PrivateShared *)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    local_b0 = 2;
    QSettings::value((QString *)&local_a8,(QVariant *)pQVar4);
    QVariant::toString();
    pDVar2 = (this->defaultAudioDriverId).d.d;
    pcVar3 = (this->defaultAudioDriverId).d.ptr;
    (this->defaultAudioDriverId).d.d = local_68.d;
    (this->defaultAudioDriverId).d.ptr = local_68.ptr;
    qVar1 = (this->defaultAudioDriverId).d.size;
    (this->defaultAudioDriverId).d.size = local_68.size;
    local_68.d = pDVar2;
    local_68.ptr = pcVar3;
    local_68.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    pQVar4 = this->settings;
    QString::QString((QString *)&local_88,"Master/DefaultAudioDevice");
    local_c8.shared = (PrivateShared *)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    local_b0 = 2;
    QSettings::value((QString *)&local_a8,(QVariant *)pQVar4);
    QVariant::toString();
    pDVar2 = (this->defaultAudioDeviceName).d.d;
    pcVar3 = (this->defaultAudioDeviceName).d.ptr;
    (this->defaultAudioDeviceName).d.d = local_68.d;
    (this->defaultAudioDeviceName).d.ptr = local_68.ptr;
    qVar1 = (this->defaultAudioDeviceName).d.size;
    (this->defaultAudioDeviceName).d.size = local_68.size;
    local_68.d = pDVar2;
    local_68.ptr = pcVar3;
    local_68.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QVariant::~QVariant((QVariant *)&local_a8);
    QVariant::~QVariant((QVariant *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    initAudioDrivers(this);
    initMidiDrivers(this);
    this->lastAudioDeviceScan = -4000000000;
    getAudioDevices((QList<const_AudioDevice_*> *)&local_48,this);
    QArrayDataPointer<const_AudioDevice_*>::~QArrayDataPointer(&local_48);
    this->pinnedSynthRoute = (SynthRoute *)0x0;
    this->audioFileWriterSynth = (QSynth *)0x0;
    qRegisterMetaType<MidiDriver*>("MidiDriver*");
    qRegisterMetaType<MidiSession*>("MidiSession*");
    qRegisterMetaType<MidiSession**>("MidiSession**");
    qRegisterMetaType<SynthState>("SynthState");
    return;
  }
  local_a8._0_4_ = 2;
  local_a8._20_4_ = 0;
  local_a8._4_8_ = 0;
  local_a8._12_8_ = 0;
  local_90 = "default";
  uVar6 = QMessageLogger::fatal((char *)local_a8.data,"Master already instantiated!");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->defaultAudioDeviceName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->defaultAudioDriverId).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->synthProfileName).d);
  QArrayDataPointer<const_AudioDevice_*>::~QArrayDataPointer(&(this->audioDevices).d);
  QArrayDataPointer<AudioDriver_*>::~QArrayDataPointer(&(this->audioDrivers).d);
  QArrayDataPointer<SynthRoute_*>::~QArrayDataPointer(&(this->synthRoutes).d);
  QObject::~QObject(&this->super_QObject);
  _Unwind_Resume(uVar6);
}

Assistant:

Master::Master() {
	if (instance != NULL) {
		qFatal("Master already instantiated!");
		// Do nothing if ignored
		return;
	}
	instance = this;
	maxSessions = 0;

	moveToThread(QCoreApplication::instance()->thread());

	MasterClock::init();

	settings = new QSettings("muntemu.org", "Munt mt32emu-qt");
	int settingsVersion = settings->value("Master/settingsVersion", 1).toInt();
	if (settingsVersion != ACTUAL_SETTINGS_VERSION) {
		migrateSettings(*settings, settingsVersion);
	}

	synthProfileName = settings->value("Master/defaultSynthProfile", "default").toString();

	trayIcon = NULL;
	defaultAudioDriverId = settings->value("Master/DefaultAudioDriver").toString();
	defaultAudioDeviceName = settings->value("Master/DefaultAudioDevice").toString();

	initAudioDrivers();
	initMidiDrivers();
	lastAudioDeviceScan = -4 * MasterClock::NANOS_PER_SECOND;
	getAudioDevices();
	pinnedSynthRoute = NULL;
	audioFileWriterSynth = NULL;

	qRegisterMetaType<MidiDriver *>("MidiDriver*");
	qRegisterMetaType<MidiSession *>("MidiSession*");
	qRegisterMetaType<MidiSession **>("MidiSession**");
	qRegisterMetaType<SynthState>("SynthState");
}